

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

size_t fs_prep_var(LexState *ls,FuncState *fs,size_t *ofsvar)

{
  byte bVar1;
  BCPos BVar2;
  VarInfo *pVVar3;
  uint64_t uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint sz;
  char *pcVar8;
  SBuf *pSVar9;
  char *pcStack_120;
  MSize len_1;
  char *p_1;
  BCPos startpc;
  GCstr *s_1;
  char *p;
  MSize len;
  GCstr *s;
  BCPos lastpc;
  MSize n;
  MSize i;
  VarInfo *ve;
  VarInfo *vs;
  size_t *ofsvar_local;
  FuncState *fs_local;
  LexState *ls_local;
  char *local_a0;
  char *local_88;
  char *local_70;
  char *w;
  char *local_10;
  
  pVVar3 = ls->vstack;
  (ls->sb).w = (ls->sb).b;
  lastpc = 0;
  bVar1 = fs->nuv;
  for (; lastpc < bVar1; lastpc = lastpc + 1) {
    uVar4 = pVVar3[fs->uvmap[lastpc]].name.gcptr64;
    uVar6 = *(int *)(uVar4 + 0x14) + 1;
    pSVar9 = &ls->sb;
    if ((uint)((int)(ls->sb).e - (int)pSVar9->w) < uVar6) {
      local_70 = lj_buf_more2(pSVar9,uVar6);
    }
    else {
      local_70 = pSVar9->w;
    }
    memcpy(local_70,(void *)(uVar4 + 0x18),(ulong)uVar6);
    (ls->sb).w = local_70 + uVar6;
  }
  *ofsvar = (ulong)(uint)((int)(ls->sb).w - (int)(ls->sb).b);
  s._4_4_ = 0;
  uVar6 = ls->vtop;
  for (ve = pVVar3 + fs->vbase; ve < pVVar3 + uVar6; ve = ve + 1) {
    if ((ve->info & 6) == 0) {
      uVar5 = (ve->name).gcptr64;
      if (uVar5 < 7) {
        pSVar9 = &ls->sb;
        if ((uint)((int)(ls->sb).e - (int)pSVar9->w) < 0xb) {
          local_88 = lj_buf_more2(pSVar9,0xb);
        }
        else {
          local_88 = pSVar9->w;
        }
        pcStack_120 = local_88 + 1;
        *local_88 = (char)uVar5;
      }
      else {
        uVar7 = *(int *)(uVar5 + 0x14) + 1;
        pSVar9 = &ls->sb;
        sz = *(int *)(uVar5 + 0x14) + 0xb;
        if ((uint)((int)(ls->sb).e - (int)pSVar9->w) < sz) {
          local_a0 = lj_buf_more2(pSVar9,sz);
        }
        else {
          local_a0 = pSVar9->w;
        }
        memcpy(local_a0,(void *)(uVar5 + 0x18),(ulong)uVar7);
        pcStack_120 = local_a0 + uVar7;
      }
      BVar2 = ve->startpc;
      pcVar8 = lj_strfmt_wuleb128(pcStack_120,BVar2 - s._4_4_);
      pcVar8 = lj_strfmt_wuleb128(pcVar8,ve->endpc - BVar2);
      (ls->sb).w = pcVar8;
      s._4_4_ = BVar2;
    }
  }
  pSVar9 = &ls->sb;
  if ((int)(ls->sb).e == (int)pSVar9->w) {
    local_10 = lj_buf_more2(pSVar9,1);
  }
  else {
    local_10 = pSVar9->w;
  }
  *local_10 = '\0';
  pSVar9->w = local_10 + 1;
  return (ulong)(uint)((int)(ls->sb).w - (int)(ls->sb).b);
}

Assistant:

static size_t fs_prep_var(LexState *ls, FuncState *fs, size_t *ofsvar)
{
  VarInfo *vs =ls->vstack, *ve;
  MSize i, n;
  BCPos lastpc;
  lj_buf_reset(&ls->sb);  /* Copy to temp. string buffer. */
  /* Store upvalue names. */
  for (i = 0, n = fs->nuv; i < n; i++) {
    GCstr *s = strref(vs[fs->uvmap[i]].name);
    MSize len = s->len+1;
    char *p = lj_buf_more(&ls->sb, len);
    p = lj_buf_wmem(p, strdata(s), len);
    ls->sb.w = p;
  }
  *ofsvar = sbuflen(&ls->sb);
  lastpc = 0;
  /* Store local variable names and compressed ranges. */
  for (ve = vs + ls->vtop, vs += fs->vbase; vs < ve; vs++) {
    if (!gola_isgotolabel(vs)) {
      GCstr *s = strref(vs->name);
      BCPos startpc;
      char *p;
      if ((uintptr_t)s < VARNAME__MAX) {
	p = lj_buf_more(&ls->sb, 1 + 2*5);
	*p++ = (char)(uintptr_t)s;
      } else {
	MSize len = s->len+1;
	p = lj_buf_more(&ls->sb, len + 2*5);
	p = lj_buf_wmem(p, strdata(s), len);
      }
      startpc = vs->startpc;
      p = lj_strfmt_wuleb128(p, startpc-lastpc);
      p = lj_strfmt_wuleb128(p, vs->endpc-startpc);
      ls->sb.w = p;
      lastpc = startpc;
    }
  }
  lj_buf_putb(&ls->sb, '\0');  /* Terminator for varinfo. */
  return sbuflen(&ls->sb);
}